

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xlsxio_write.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  time_t tVar2;
  int local_24;
  int i;
  xlsxiowriter handle;
  char **argv_local;
  int argc_local;
  
  lVar1 = xlsxiowrite_open(filename,"MySheet");
  if (lVar1 == 0) {
    fprintf(_stderr,"Error creating .xlsx file\n");
    argv_local._4_4_ = 1;
  }
  else {
    xlsxiowrite_set_row_height(lVar1,1);
    xlsxiowrite_set_detection_rows(lVar1,10);
    xlsxiowrite_add_column(lVar1,"Col1",0);
    xlsxiowrite_add_column(lVar1,"Col2",0x15);
    xlsxiowrite_add_column(lVar1,"Col3",0);
    xlsxiowrite_add_column(lVar1,"Col4",2);
    xlsxiowrite_add_column(lVar1,"Col5",0);
    xlsxiowrite_add_column(lVar1,"Col6",0);
    xlsxiowrite_add_column(lVar1,"Col7",0);
    xlsxiowrite_next_row(lVar1);
    for (local_24 = 0; local_24 < 1000; local_24 = local_24 + 1) {
      xlsxiowrite_add_cell_string(lVar1,"Test");
      xlsxiowrite_add_cell_string(lVar1,"A b  c   d    e     f\nnew line");
      xlsxiowrite_add_cell_string(lVar1,"&% <test> \"\'");
      xlsxiowrite_add_cell_string(lVar1,0);
      xlsxiowrite_add_cell_int(lVar1,(long)local_24);
      tVar2 = time((time_t *)0x0);
      xlsxiowrite_add_cell_datetime(lVar1,tVar2);
      xlsxiowrite_add_cell_float(0x400921fb4d12d84a,lVar1);
      xlsxiowrite_next_row(lVar1);
    }
    xlsxiowrite_close(lVar1);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char* argv[])
{
  xlsxiowriter handle;
  //open .xlsx file for writing (will overwrite if it already exists)
  if ((handle = xlsxiowrite_open(filename, "MySheet")) == NULL) {
    fprintf(stderr, "Error creating .xlsx file\n");
    return 1;
  }
  //set row height
  xlsxiowrite_set_row_height(handle, 1);
  //how many rows to buffer to detect column widths
  xlsxiowrite_set_detection_rows(handle, 10);
  //write column names
  xlsxiowrite_add_column(handle, "Col1", 0);
  xlsxiowrite_add_column(handle, "Col2", 21);
  xlsxiowrite_add_column(handle, "Col3", 0);
  xlsxiowrite_add_column(handle, "Col4", 2);
  xlsxiowrite_add_column(handle, "Col5", 0);
  xlsxiowrite_add_column(handle, "Col6", 0);
  xlsxiowrite_add_column(handle, "Col7", 0);
  xlsxiowrite_next_row(handle);
  //write data
  int i;
  for (i = 0; i < 1000; i++) {
    xlsxiowrite_add_cell_string(handle, "Test");
    xlsxiowrite_add_cell_string(handle, "A b  c   d    e     f\nnew line");
    xlsxiowrite_add_cell_string(handle, "&% <test> \"'");
    xlsxiowrite_add_cell_string(handle, NULL);
    xlsxiowrite_add_cell_int(handle, i);
    xlsxiowrite_add_cell_datetime(handle, time(NULL));
    xlsxiowrite_add_cell_float(handle, 3.1415926);
    xlsxiowrite_next_row(handle);
  }
  //close .xlsx file
  xlsxiowrite_close(handle);
  return 0;
}